

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.hxx
# Opt level: O1

void lineage::validate(ProblemGraph *problemGraph,Solution *solution)

{
  Graph *graph;
  Problem *pPVar1;
  pointer pvVar2;
  unsigned_long uVar3;
  pointer pEVar4;
  Value VVar5;
  Value VVar6;
  size_t vs;
  size_t vt;
  bool bVar7;
  ostream *poVar8;
  pointer pRVar9;
  size_t sVar10;
  pointer puVar11;
  ulong uVar12;
  pointer pAVar13;
  ComponentLabeling componentsPerFrame;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> descendantComponents;
  ComponentLabeling components;
  SubgraphWithoutCut subgraphCut;
  SubgraphCutPerFrame subgraphCutPerFrame;
  SubgraphCutTwoFrames subgraph;
  ulong local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  ulong local_d0;
  undefined1 local_c8 [16];
  _Base_ptr local_b8;
  _Base_ptr p_Stack_b0;
  _Base_ptr local_a8;
  _Map_pointer ppuStack_a0;
  _Elt_pointer local_98;
  _Elt_pointer puStack_90;
  _Elt_pointer local_88;
  _Map_pointer ppuStack_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  SubgraphWithoutCut local_60;
  SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  
  pPVar1 = problemGraph->problem_;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.edgeLabels_ = &solution->edge_labels;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&local_78,
             (long)(problemGraph->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(problemGraph->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  graph = &problemGraph->graph_;
  andres::graph::
  labelComponents<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::validate(lineage::ProblemGraph_const&,lineage::Solution_const&)::SubgraphWithoutCut,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (graph,&local_60,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start);
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.problem_ = pPVar1;
  local_58.edgeLabels_ = &solution->edge_labels;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&local_e8,
             (long)(problemGraph->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(problemGraph->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  andres::graph::
  labelComponents<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (graph,&local_58,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"overall: ",9);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," nodes, ",8);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," edges",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (problemGraph->numberOfFrames_ != 0) {
    local_120 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"frame ",6);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," nodes, ",8);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," edges",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if (local_120 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"   ",3);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," inter-frame edges with frame ",0x1e);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      if (local_120 != problemGraph->numberOfFrames_ - 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"   ",3);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," inter-frame edges with frame ",0x1e);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      pvVar2 = (problemGraph->edgeIndicesInFrame_).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar11 = pvVar2[local_120].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar2[local_120].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data + 8) == puVar11) {
LAB_00115938:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"   the intra-frame edges labeled 1 well-define a multicut"
                   ,0x39);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
        std::ostream::put('p');
        std::ostream::flush();
      }
      else {
        bVar7 = true;
        uVar12 = 0;
        do {
          uVar3 = puVar11[uVar12];
          pEVar4 = (problemGraph->graph_).edges_.
                   super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          VVar5 = pEVar4[uVar3].vertexIndices_[0];
          VVar6 = pEVar4[uVar3].vertexIndices_[1];
          if ((local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[VVar5] !=
              local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[VVar6]) ==
              ((solution->edge_labels).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3] == '\0')) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"   error: the intra-frame edge ",0x1f);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," between nodes ",0xf);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," (t=",4);
            poVar8 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar8,
                                (problemGraph->problem_->nodes).
                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                _M_impl.super__Vector_impl_data._M_start[VVar5].t);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", cx=",5);
            poVar8 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar8,
                                *(int *)((long)((problemGraph->problem_->nodes).
                                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                ._M_impl.super__Vector_impl_data._M_start + VVar5) +
                                        8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", cy=",5);
            poVar8 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar8,
                                *(int *)((long)((problemGraph->problem_->nodes).
                                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                ._M_impl.super__Vector_impl_data._M_start + VVar5) +
                                        0xc));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", frame component=",0x12);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," (t=",4);
            poVar8 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar8,
                                (problemGraph->problem_->nodes).
                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                _M_impl.super__Vector_impl_data._M_start[VVar6].t);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", cx=",5);
            poVar8 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar8,
                                *(int *)((long)((problemGraph->problem_->nodes).
                                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                ._M_impl.super__Vector_impl_data._M_start + VVar6) +
                                        8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", cy=",5);
            poVar8 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar8,
                                *(int *)((long)((problemGraph->problem_->nodes).
                                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                ._M_impl.super__Vector_impl_data._M_start + VVar6) +
                                        0xc));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", frame component=",0x12);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,") is part of a violated cycle constraint.",0x29);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            bVar7 = false;
          }
          uVar12 = uVar12 + 1;
          pvVar2 = (problemGraph->edgeIndicesInFrame_).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar11 = pvVar2[local_120].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar12 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar2[local_120].
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)puVar11 >> 3));
        if (bVar7) goto LAB_00115938;
      }
      if ((local_120 < problemGraph->numberOfFrames_ - 1) &&
         (pvVar2 = (problemGraph->nodeIndicesInFrame_).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         puVar11 = pvVar2[local_120].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,
         *(pointer *)
          ((long)&pvVar2[local_120].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data + 8) != puVar11)) {
        uVar12 = 0;
        do {
          uVar3 = puVar11[uVar12];
          local_c8._8_8_ = local_c8._8_8_ & 0xffffffff00000000;
          local_b8 = (_Base_ptr)0x0;
          p_Stack_b0 = (_Base_ptr)(local_c8 + 8);
          ppuStack_a0 = (_Map_pointer)0x0;
          pRVar9 = (graph->vertices_).
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_a8 = p_Stack_b0;
          for (pAVar13 = *(pointer *)
                          &pRVar9[uVar3].vector_.
                           super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
              ; pAVar13 !=
                *(pointer *)
                 ((long)&pRVar9[uVar3].vector_.
                         super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                 + 8); pAVar13 = pAVar13 + 1) {
            if ((local_120 + 1 ==
                 (long)(pPVar1->nodes).
                       super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                       super__Vector_impl_data._M_start[pAVar13->vertex_].t) &&
               ((solution->edge_labels).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[pAVar13->edge_] == '\0')) {
              std::
              _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              ::_M_insert_unique<unsigned_long_const&>
                        ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                          *)local_c8,
                         local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start + pAVar13->vertex_);
            }
            pRVar9 = (graph->vertices_).
                     super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          if (ppuStack_a0 == (_Map_pointer)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"   warning: node ",0x11);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," (t=",4);
            poVar8 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar8,
                                (problemGraph->problem_->nodes).
                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar3].t);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", cx=",5);
            poVar8 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar8,
                                *(int *)((long)((problemGraph->problem_->nodes).
                                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar3) +
                                        8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", cy=",5);
            poVar8 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar8,
                                *(int *)((long)((problemGraph->problem_->nodes).
                                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar3) +
                                        0xc));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", frame component=",0x12);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,") has *no* descendant in frame ",0x1f);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
LAB_00115cab:
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
          else if (ppuStack_a0 != (_Map_pointer)0x1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"   warning: node ",0x11);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," (t=",4);
            poVar8 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar8,
                                *(int *)((long)((problemGraph->problem_->nodes).
                                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar3) +
                                        8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", cx=",5);
            poVar8 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar8,
                                *(int *)((long)((problemGraph->problem_->nodes).
                                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar3) +
                                        8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", cy=",5);
            poVar8 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar8,
                                *(int *)((long)((problemGraph->problem_->nodes).
                                                super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar3) +
                                        0xc));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", frame component=",0x12);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,") has ",6);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," descendants in frame ",0x16)
            ;
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            goto LAB_00115cab;
          }
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)local_c8);
          uVar12 = uVar12 + 1;
          pvVar2 = (problemGraph->nodeIndicesInFrame_).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar11 = pvVar2[local_120].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar12 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar2[local_120].
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)puVar11 >> 3));
      }
      if (local_120 != 0) {
        pvVar2 = (problemGraph->nodeIndicesInFrame_).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar11 = pvVar2[local_120].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar2[local_120].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data + 8) == puVar11) {
LAB_0011606d:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"   labeling of incoming inter-frame edges is moral",0x32
                    );
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
          std::ostream::put('p');
          std::ostream::flush();
        }
        else {
          bVar7 = true;
          uVar12 = 0;
          do {
            uVar3 = puVar11[uVar12];
            local_c8._8_8_ = local_c8._8_8_ & 0xffffffff00000000;
            local_b8 = (_Base_ptr)0x0;
            p_Stack_b0 = (_Base_ptr)(local_c8 + 8);
            ppuStack_a0 = (_Map_pointer)0x0;
            pRVar9 = (graph->vertices_).
                     super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_d0 = uVar12;
            local_a8 = p_Stack_b0;
            for (pAVar13 = *(pointer *)
                            &pRVar9[uVar3].vector_.
                             super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                ; pAVar13 !=
                  *(pointer *)
                   ((long)&pRVar9[uVar3].vector_.
                           super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                   + 8); pAVar13 = pAVar13 + 1) {
              if (((local_120 - 1 ==
                    (long)(pPVar1->nodes).
                          super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                          super__Vector_impl_data._M_start[pAVar13->vertex_].t) &&
                  ((solution->edge_labels).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start[pAVar13->edge_] == '\0')) &&
                 (std::
                  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  ::_M_insert_unique<unsigned_long_const&>
                            ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                              *)local_c8,
                             local_e8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + pAVar13->vertex_),
                 (_Map_pointer)0x1 < ppuStack_a0)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"   error: morality violated at node ",0x24);
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8," (t=",4);
                poVar8 = (ostream *)
                         std::ostream::operator<<
                                   ((ostream *)poVar8,
                                    (problemGraph->problem_->nodes).
                                    super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar3].t);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,", cx=",5);
                poVar8 = (ostream *)
                         std::ostream::operator<<
                                   ((ostream *)poVar8,
                                    *(int *)((long)((problemGraph->problem_->nodes).
                                                                                                        
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar3)
                                            + 8));
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,", cy=",5);
                poVar8 = (ostream *)
                         std::ostream::operator<<
                                   ((ostream *)poVar8,
                                    *(int *)((long)((problemGraph->problem_->nodes).
                                                                                                        
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar3)
                                            + 0xc));
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,", frame component=",0x12)
                ;
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                std::ostream::put((char)poVar8);
                std::ostream::flush();
                bVar7 = false;
              }
              pRVar9 = (graph->vertices_).
                       super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
            if (ppuStack_a0 == (_Map_pointer)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"   warning: node ",0x11);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," (t=",4);
              poVar8 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar8,
                                  (problemGraph->problem_->nodes).
                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar3].t);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,", cx=",5);
              poVar8 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar8,
                                  *(int *)((long)((problemGraph->problem_->nodes).
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar3)
                                          + 8));
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,", cy=",5);
              poVar8 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar8,
                                  *(int *)((long)((problemGraph->problem_->nodes).
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar3)
                                          + 0xc));
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,", frame component=",0x12);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,") has no ancestor in frame ",0x1b);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
            }
            std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)local_c8);
            uVar12 = local_d0 + 1;
            pvVar2 = (problemGraph->nodeIndicesInFrame_).
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar11 = pvVar2[local_120].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
          } while (uVar12 < (ulong)((long)*(pointer *)
                                           ((long)&pvVar2[local_120].
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                    (long)puVar11 >> 3));
          if (bVar7) goto LAB_0011606d;
        }
        if (local_120 != 0) {
          sVar10 = local_120 - 1;
          pvVar2 = (problemGraph->edgeIndicesFromFrame_).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar11 = pvVar2[sVar10].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_48.problem_ = pPVar1;
          local_48.edgeLabels_ = &solution->edge_labels;
          local_48.firstFrame_ = sVar10;
          if (*(pointer *)
               ((long)&pvVar2[sVar10].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data + 8) != puVar11) {
            local_d0 = CONCAT44(local_d0._4_4_,(int)CONCAT71((int7)((ulong)pvVar2 >> 8),1));
            uVar12 = 0;
            do {
              uVar3 = puVar11[uVar12];
              if ((solution->edge_labels).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3] == '\x01') {
                pEVar4 = (problemGraph->graph_).edges_.
                         super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                vs = pEVar4[uVar3].vertexIndices_[0];
                vt = pEVar4[uVar3].vertexIndices_[1];
                local_88 = (_Elt_pointer)0x0;
                ppuStack_80 = (_Map_pointer)0x0;
                local_98 = (_Elt_pointer)0x0;
                puStack_90 = (_Elt_pointer)0x0;
                local_a8 = (_Base_ptr)0x0;
                ppuStack_a0 = (_Map_pointer)0x0;
                local_b8 = (_Base_ptr)0x0;
                p_Stack_b0 = (_Base_ptr)0x0;
                local_c8._0_8_ = (_Map_pointer)0x0;
                local_c8._8_8_ = 0;
                std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                          ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,0)
                ;
                bVar7 = andres::graph::
                        spsp<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::ProblemGraph::SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                  (graph,&local_48,vs,vt,
                                   (deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8)
                ;
                if (bVar7) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"   error: the inter-frame edge ",0x1f);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," between nodes ",0xf);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," (t=",4);
                  poVar8 = (ostream *)
                           std::ostream::operator<<
                                     ((ostream *)poVar8,
                                      (problemGraph->problem_->nodes).
                                      super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                      ._M_impl.super__Vector_impl_data._M_start[vs].t);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", cx=",5);
                  poVar8 = (ostream *)
                           std::ostream::operator<<
                                     ((ostream *)poVar8,
                                      *(int *)((long)((problemGraph->problem_->nodes).
                                                                                                            
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + vs) +
                                              8));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", cy=",5);
                  poVar8 = (ostream *)
                           std::ostream::operator<<
                                     ((ostream *)poVar8,
                                      *(int *)((long)((problemGraph->problem_->nodes).
                                                                                                            
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + vs) +
                                              0xc));
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8,", frame component=",0x12);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,") and ",6);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," (t=",4);
                  poVar8 = (ostream *)
                           std::ostream::operator<<
                                     ((ostream *)poVar8,
                                      (problemGraph->problem_->nodes).
                                      super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                      ._M_impl.super__Vector_impl_data._M_start[vt].t);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", cx=",5);
                  poVar8 = (ostream *)
                           std::ostream::operator<<
                                     ((ostream *)poVar8,
                                      *(int *)((long)((problemGraph->problem_->nodes).
                                                                                                            
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + vt) +
                                              8));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", cy=",5);
                  poVar8 = (ostream *)
                           std::ostream::operator<<
                                     ((ostream *)poVar8,
                                      *(int *)((long)((problemGraph->problem_->nodes).
                                                                                                            
                                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + vt) +
                                              0xc));
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8,", frame component=",0x12);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8,") is part of a violated inter-frame cycle constraint.",0x35);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  local_d0 = local_d0 & 0xffffffff00000000;
                }
                std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                          ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8);
              }
              uVar12 = uVar12 + 1;
              pvVar2 = (problemGraph->edgeIndicesFromFrame_).
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar11 = pvVar2[sVar10].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
            } while (uVar12 < (ulong)((long)*(pointer *)
                                             ((long)&pvVar2[sVar10].
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                      (long)puVar11 >> 3));
            if ((local_d0 & 1) == 0) goto LAB_0011641a;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "   labeling of incoming inter-frame edges satisfies cycle constraints",0x45);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
          std::ostream::put('p');
          std::ostream::flush();
        }
      }
LAB_0011641a:
      local_120 = local_120 + 1;
    } while (local_120 < problemGraph->numberOfFrames_);
  }
  if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

inline
void validate(ProblemGraph const& problemGraph, Solution const& solution)
{
    struct SubgraphWithoutCut
    {
        SubgraphWithoutCut(lineage::Solution::EdgeLabels const& edgeLabels) :
            edgeLabels_(edgeLabels)
        {}
        
        bool vertex(size_t i) const
        { 
            return true;
        }
        
        bool edge(size_t i) const
        {
            return edgeLabels_[i] == 0;
        }

        lineage::Solution::EdgeLabels const& edgeLabels_;
    };

    typedef ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<lineage::Solution::EdgeLabels> SubgraphCutPerFrame;
    typedef ProblemGraph::SubgraphOfTwoFramesWithoutCut<lineage::Solution::EdgeLabels> SubgraphCutTwoFrames;
    typedef andres::graph::ComponentsBySearch<ProblemGraph::Graph> ComponentLabeling;

    Problem const& problem = problemGraph.problem();

    ComponentLabeling components;
    SubgraphWithoutCut subgraphCut(solution.edge_labels);
    components.build(problemGraph.graph(), subgraphCut);

    ComponentLabeling componentsPerFrame;
    SubgraphCutPerFrame subgraphCutPerFrame(problem, solution.edge_labels);
    componentsPerFrame.build(problemGraph.graph(), subgraphCutPerFrame);

    // print numbers of nodes and edges
    std::cerr << "overall: " << problem.nodes.size()
        << " nodes, " << problem.edges.size()
        << " edges" << std::endl;

    for (size_t frame = 0; frame < problemGraph.numberOfFrames(); ++frame)
    {
        std::cerr << "frame " << frame
            << ": " << problemGraph.numberOfNodesInFrame(frame)
            << " nodes, " << problemGraph.numberOfEdgesInFrame(frame)
            << " edges" << std::endl;

        if (frame != 0)
            std::cerr << "   " << problemGraph.numberOfEdgesFromFrame(frame-1)
                << " inter-frame edges with frame " << frame - 1
                << std::endl;
        
        if (frame != problemGraph.numberOfFrames() - 1)
            std::cerr << "   " << problemGraph.numberOfEdgesFromFrame(frame)
                << " inter-frame edges with frame " << frame + 1
                << std::endl;

        // test whether edges labeled 1 well-define a multicut
        bool isMulticut = true;
        for (size_t j = 0; j < problemGraph.numberOfEdgesInFrame(frame); ++j)
        {
            auto e = problemGraph.edgeInFrame(frame, j);

            auto v0 = problemGraph.graph().vertexOfEdge(e, 0);
            auto v1 = problemGraph.graph().vertexOfEdge(e, 1);

            if ((solution.edge_labels[e] == 0) != (componentsPerFrame.labels_[v0] == componentsPerFrame.labels_[v1]))
            {
                std::cerr << "   error: the intra-frame edge " << e
                    << " between nodes " << v0
                    << " (t=" << problemGraph.problem().nodes[v0].t
                    << ", cx=" << problemGraph.problem().nodes[v0].cx
                    << ", cy=" << problemGraph.problem().nodes[v0].cy
                    << ", frame component=" << componentsPerFrame.labels_[v0]
                    << ") and " << v1
                    << " (t=" << problemGraph.problem().nodes[v1].t
                    << ", cx=" << problemGraph.problem().nodes[v1].cx
                    << ", cy=" << problemGraph.problem().nodes[v1].cy
                    << ", frame component=" << componentsPerFrame.labels_[v1]
                    << ") is part of a violated cycle constraint."
                    << std::endl;

                isMulticut = false;
            }
        }

        if (isMulticut)
            std::cerr << "   the intra-frame edges labeled 1 well-define a multicut" << std::endl;

        // report splits and nodes without descendants
        if (frame < problemGraph.numberOfFrames() - 1)
            for (size_t j = 0; j < problemGraph.numberOfNodesInFrame(frame); ++j)
            {
                auto v0 = problemGraph.nodeInFrame(frame, j);

                std::set<size_t> descendantComponents;
                for (auto it = problemGraph.graph().adjacenciesFromVertexBegin(v0); it != problemGraph.graph().adjacenciesFromVertexEnd(v0); ++it)
                {
                    auto e = it->edge();
                    auto v1 = it->vertex();

                    if (problem.nodes[v1].t == frame + 1 && solution.edge_labels[e] == 0)
                        descendantComponents.insert(componentsPerFrame.labels_[v1]);
                }

                if (descendantComponents.size() == 0)
                    std::cerr << "   warning: node " << v0
                        << " (t=" << problemGraph.problem().nodes[v0].t
                        << ", cx=" << problemGraph.problem().nodes[v0].cx
                        << ", cy=" << problemGraph.problem().nodes[v0].cy
                        << ", frame component=" << componentsPerFrame.labels_[v0]
                        << ") has *no* descendant in frame " << frame + 1
                        << std::endl;
                else if (descendantComponents.size() > 1)
                    std::cerr << "   warning: node " << v0
                        << " (t=" << problemGraph.problem().nodes[v0].cx
                        << ", cx=" << problemGraph.problem().nodes[v0].cx
                        << ", cy=" << problemGraph.problem().nodes[v0].cy
                        << ", frame component=" << componentsPerFrame.labels_[v0]
                        << ") has " << descendantComponents.size()
                        << " descendants in frame " << frame + 1
                        << std::endl;
            }

        // test morality and report nodes without ancestors
        bool isMoral = true;
        if (frame != 0)
        {
            for (size_t j = 0; j < problemGraph.numberOfNodesInFrame(frame); ++j)
            {
                auto v0 = problemGraph.nodeInFrame(frame, j);

                std::set<size_t> ancestorComponents;
                for (auto it = problemGraph.graph().adjacenciesFromVertexBegin(v0); it != problemGraph.graph().adjacenciesFromVertexEnd(v0); ++it)
                {
                    auto e = it->edge();
                    auto v1 = it->vertex();
                    
                    if (problem.nodes[v1].t == frame - 1 && solution.edge_labels[e] == 0)
                    {
                        ancestorComponents.insert(componentsPerFrame.labels_[v1]);

                        if (ancestorComponents.size() > 1)
                        {
                            isMoral = false;

                            std::cerr << "   error: morality violated at node " << v0
                                << " (t=" << problemGraph.problem().nodes[v0].t
                                << ", cx=" << problemGraph.problem().nodes[v0].cx
                                << ", cy=" << problemGraph.problem().nodes[v0].cy
                                << ", frame component=" << componentsPerFrame.labels_[v0]
                                << ")" << std::endl;
                        }
                    }
                }

                if (ancestorComponents.size() == 0)
                    std::cerr << "   warning: node " << v0
                        << " (t=" << problemGraph.problem().nodes[v0].t
                        << ", cx=" << problemGraph.problem().nodes[v0].cx
                        << ", cy=" << problemGraph.problem().nodes[v0].cy
                        << ", frame component=" << componentsPerFrame.labels_[v0]
                        << ") has no ancestor in frame " << frame - 1
                        << std::endl;
            }
            
            if (isMoral)
                std::cerr << "   labeling of incoming inter-frame edges is moral" << std::endl;
        }

        // test cycle constraints of inter-frame edges
        if (frame != 0)
        {
            SubgraphCutTwoFrames subgraph(problem, solution.edge_labels, frame - 1);

            bool cycleConstraintsSatisfied = true;
            for (size_t j = 0; j < problemGraph.numberOfEdgesFromFrame(frame - 1); ++j)
            {
                auto e = problemGraph.edgeFromFrame(frame - 1, j);

                if (solution.edge_labels[e] == 1) // cut
                {
                    auto v0 = problemGraph.graph().vertexOfEdge(e, 0);
                    auto v1 = problemGraph.graph().vertexOfEdge(e, 1);
                    
                    std::deque<std::size_t> path;
                    if (andres::graph::spsp(problemGraph.graph(), subgraph, v0, v1, path) == true)
                    {
                        cycleConstraintsSatisfied = false;

                        std::cerr << "   error: the inter-frame edge " << e
                            << " between nodes " << v0
                            << " (t=" << problemGraph.problem().nodes[v0].t
                            << ", cx=" << problemGraph.problem().nodes[v0].cx
                            << ", cy=" << problemGraph.problem().nodes[v0].cy
                            << ", frame component=" << componentsPerFrame.labels_[v0]
                            << ") and " << v1
                            << " (t=" << problemGraph.problem().nodes[v1].t
                            << ", cx=" << problemGraph.problem().nodes[v1].cx
                            << ", cy=" << problemGraph.problem().nodes[v1].cy
                            << ", frame component=" << componentsPerFrame.labels_[v1]
                            << ") is part of a violated inter-frame cycle constraint."
                            << std::endl;
                    }
                }
            }

            if (cycleConstraintsSatisfied)
                std::cerr << "   labeling of incoming inter-frame edges satisfies cycle constraints" << std::endl;
        }
    }
}